

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O2

ArrayPtr<capnp::word> __thiscall
capnp::MallocMessageBuilder::allocateSegment(MallocMessageBuilder *this,uint minimumSize)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong __nmemb;
  ArrayPtr<capnp::word> AVar5;
  void *result;
  uint size;
  Fault f_2;
  
  if (0x1fffffff < minimumSize) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[80]>
              ((Fault *)&result,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message.c++"
               ,0xed,FAILED,"bounded(minimumSize) * WORDS <= MAX_SEGMENT_WORDS",
               "\"MallocMessageBuilder asked to allocate segment above maximum serializable size.\""
               ,(char (*) [80])
                "MallocMessageBuilder asked to allocate segment above maximum serializable size.");
    kj::_::Debug::Fault::fatal((Fault *)&result);
  }
  uVar2 = *(uint *)&(this->super_MessageBuilder).field_0xbc;
  __nmemb = (ulong)uVar2;
  if (0x1fffffff < __nmemb) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
              ((Fault *)&result,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message.c++"
               ,0xef,FAILED,"bounded(nextSize) * WORDS <= MAX_SEGMENT_WORDS",
               "\"MallocMessageBuilder nextSize out of bounds.\"",
               (char (*) [45])"MallocMessageBuilder nextSize out of bounds.");
    kj::_::Debug::Fault::fatal((Fault *)&result);
  }
  bVar1 = this->returnedFirstSegment;
  if ((bVar1 == false) && (this->ownFirstSegment == false)) {
    if (minimumSize <= uVar2) {
      result = this->firstSegment;
      this->returnedFirstSegment = true;
      goto LAB_00421665;
    }
    this->ownFirstSegment = true;
  }
  if (uVar2 < minimumSize) {
    __nmemb = (ulong)minimumSize;
  }
  uVar4 = (uint)__nmemb;
  size = uVar4;
  result = calloc(__nmemb,8);
  if ((word *)result == (word *)0x0) {
    kj::_::Debug::Fault::Fault<int,unsigned_int&>
              (&f_2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message.c++"
               ,0x101,0xc,"calloc(size, sizeof(word))","size",&size);
    kj::_::Debug::Fault::fatal(&f_2);
  }
  if (bVar1 == false) {
    this->firstSegment = result;
    this->returnedFirstSegment = true;
    uVar3 = uVar4;
    if (this->allocationStrategy != GROW_HEURISTICALLY) goto LAB_00421665;
  }
  else {
    kj::Vector<void*>::add<void*&>((Vector<void*> *)&this->moreSegments,&result);
    if (this->allocationStrategy != GROW_HEURISTICALLY) goto LAB_00421665;
    uVar2 = *(uint *)&(this->super_MessageBuilder).field_0xbc;
    uVar3 = 0x1fffffff;
    if (__nmemb <= 0x1fffffff - (ulong)uVar2) {
      uVar3 = uVar4 + uVar2;
    }
  }
  *(uint *)&(this->super_MessageBuilder).field_0xbc = uVar3;
LAB_00421665:
  AVar5.size_ = __nmemb;
  AVar5.ptr = (word *)result;
  return AVar5;
}

Assistant:

kj::ArrayPtr<word> MallocMessageBuilder::allocateSegment(uint minimumSize) {
  KJ_REQUIRE(bounded(minimumSize) * WORDS <= MAX_SEGMENT_WORDS,
      "MallocMessageBuilder asked to allocate segment above maximum serializable size.");
  KJ_ASSERT(bounded(nextSize) * WORDS <= MAX_SEGMENT_WORDS,
      "MallocMessageBuilder nextSize out of bounds.");

  if (!returnedFirstSegment && !ownFirstSegment) {
    kj::ArrayPtr<word> result = kj::arrayPtr(reinterpret_cast<word*>(firstSegment), nextSize);
    if (result.size() >= minimumSize) {
      returnedFirstSegment = true;
      return result;
    }
    // If the provided first segment wasn't big enough, we discard it and proceed to allocate
    // our own.  This never happens in practice since minimumSize is always 1 for the first
    // segment.
    ownFirstSegment = true;
  }

  uint size = kj::max(minimumSize, nextSize);

  void* result = calloc(size, sizeof(word));
  if (result == nullptr) {
    KJ_FAIL_SYSCALL("calloc(size, sizeof(word))", ENOMEM, size);
  }

  if (!returnedFirstSegment) {
    firstSegment = result;
    returnedFirstSegment = true;

    // After the first segment, we want nextSize to equal the total size allocated so far.
    if (allocationStrategy == AllocationStrategy::GROW_HEURISTICALLY) nextSize = size;
  } else {
    moreSegments.add(result);
    if (allocationStrategy == AllocationStrategy::GROW_HEURISTICALLY) {
      // set nextSize = min(nextSize+size, MAX_SEGMENT_WORDS)
      // while protecting against possible overflow of (nextSize+size)
      nextSize = (size <= unbound(MAX_SEGMENT_WORDS / WORDS) - nextSize)
          ? nextSize + size : unbound(MAX_SEGMENT_WORDS / WORDS);
    }
  }

  return kj::arrayPtr(reinterpret_cast<word*>(result), size);
}